

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O0

void __thiscall
pzgeom::TPZArc3D::TPZArc3D
          (TPZArc3D *this,TPZArc3D *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  void **in_RDX;
  TPZNodeRep<3,_pztopology::TPZLine> *in_RSI;
  TPZManVector<double,_3> *in_RDI;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffff98;
  TPZFNMatrix<9,_double> *this_00;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffffb0;
  TPZManVector<double,_3> *this_01;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *gl2lcNdMap_00;
  TPZNodeRep<3,_pztopology::TPZLine> *cp_00;
  
  cp_00 = (TPZNodeRep<3,_pztopology::TPZLine> *)0x0;
  gl2lcNdMap_00 =
       (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZArc3D>((TPZRegisterClassId *)in_RDI,0x21);
  TPZNodeRep<3,_pztopology::TPZLine>::TPZNodeRep(in_RSI,in_RDX,cp_00,gl2lcNdMap_00);
  (in_RDI->super_TPZVec<double>)._vptr_TPZVec = (_func_int **)&PTR__TPZArc3D_0246dcf8;
  this_01 = (TPZManVector<double,_3> *)in_RDI->fExtAlloc;
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_ffffffffffffffb0);
  TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_RDI[4].fExtAlloc);
  TPZManVector<double,_3>::TPZManVector(this_01,(int64_t)in_RDI);
  this_00 = (TPZFNMatrix<9,_double> *)in_RDI[9].fExtAlloc;
  TPZManVector<double,_3>::TPZManVector(this_01,(int64_t)in_RDI);
  TPZFNMatrix<9,_double>::operator=(this_00,in_stack_ffffffffffffff98);
  TPZFNMatrix<9,_double>::operator=(this_00,in_stack_ffffffffffffff98);
  TPZManVector<double,_3>::operator=(this_01,in_RDI);
  TPZManVector<double,_3>::operator=(this_01,in_RDI);
  in_RDI[10].fExtAlloc[1] = (double)in_RSI[0x12].fNodeIndexes[2];
  in_RDI[10].fExtAlloc[0] = (double)in_RSI[0x12].fNodeIndexes[1];
  in_RDI[10].fExtAlloc[2] = (double)in_RSI[0x13].super_TPZLine.super_TPZSavable._vptr_TPZSavable;
  in_RDI[0xb].super_TPZVec<double>._vptr_TPZVec = (_func_int **)in_RSI[0x13].fNodeIndexes[0];
  return;
}

Assistant:

TPZArc3D(const TPZArc3D &cp,std::map<int64_t,int64_t> & gl2lcNdMap) : 
            TPZRegisterClassId(&TPZArc3D::ClassId),
            pzgeom::TPZNodeRep<NNodes,pztopology::TPZLine>(cp,gl2lcNdMap){
			this->fICnBase = cp.fICnBase;
			this->fIBaseCn = cp.fIBaseCn;
			this->fCenter3D = cp.fCenter3D;
                this->finitialVector = cp.finitialVector;
                
			this->fRadius = cp.fRadius;
                this->fAngle = cp.fAngle;
                this->fXcenter = cp.fXcenter;
                this->fYcenter = cp.fYcenter;
		}